

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

double __thiscall MultivariateTracker::getCovariance(MultivariateTracker *this,long i,long j)

{
  int iVar1;
  long lVar2;
  const_reference pvVar3;
  runtime_error *this_00;
  long lVar4;
  
  lVar2 = (long)(this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar4 = lVar2 % 0xe8;
  if (-1 < i) {
    iVar1 = (int)(lVar2 / 0xe8);
    lVar4 = (long)iVar1;
    if (((j < lVar4) && (-1 < j)) && (i < lVar4)) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (&this->_covariance,(long)((int)j + iVar1 * (int)i));
      return *pvVar3;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10,i,lVar4);
  std::runtime_error::runtime_error(this_00,"Invalid covariance indices");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double
    getCovariance(long const i,
                  long const j) const
    {
        const int numPoints = this->_statistics.size();
        if ((i < 0) || (i >= numPoints) || (j < 0) || (j >= numPoints)) throw std::runtime_error("Invalid covariance indices");
        int k = i * numPoints + j;
        return this->_covariance.at(k);
    }